

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

Error __thiscall
wave::File::Write(File *this,vector<float,_std::allocator<float>_> *data,
                 _func_void_char_ptr_size_t *encrypt)

{
  float fVar1;
  uint16_t uVar2;
  _Head_base<0UL,_wave::File::Impl_*,_false> this_00;
  char cVar3;
  int iVar4;
  Error EVar5;
  uint64_t uVar6;
  float *pfVar7;
  int *piVar8;
  float *pfVar9;
  ofstream *poVar10;
  float *pfVar11;
  ushort uVar12;
  int8_t value;
  int8_t value_2 [3];
  int16_t value_1;
  int32_t value_3;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined2 local_5a;
  _func_void_char_ptr_size_t *local_58;
  int local_4c;
  vector<float,_std::allocator<float>_> *local_48;
  uint64_t local_40;
  float *local_38;
  
  this_00._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>._M_t.
       super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
       super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl;
  local_58 = encrypt;
  cVar3 = std::__basic_file<char>::is_open();
  EVar5 = kNotOpen;
  if (cVar3 != '\0') {
    uVar6 = Impl::current_sample_index(this_00._M_head_impl);
    pfVar7 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar11 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pfVar9 = pfVar7;
    if (pfVar7 != pfVar11) {
      uVar2 = *(uint16_t *)
               ((long)&((this->impl_)._M_t.
                        super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                        .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->header +
               0x22);
      uVar12 = uVar2 << 0xd | (ushort)(uVar2 - 8) >> 3;
      local_48 = data;
      local_40 = uVar6;
      local_38 = pfVar11;
      if (3 < uVar12) {
        return kInvalidFormat;
      }
      do {
        fVar1 = *pfVar7;
        if (uVar12 == 2) {
          iVar4 = (int)(fVar1 * 8388607.0);
          local_5d = (undefined1)iVar4;
          local_5c = (undefined1)((uint)iVar4 >> 8);
          local_5b = (undefined1)((uint)iVar4 >> 0x10);
          piVar8 = (int *)&local_5d;
          (*local_58)((char *)piVar8,3);
          poVar10 = &((this->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
          pfVar11 = local_38;
        }
        else if (uVar12 == 1) {
          local_5a = (undefined2)(int)(fVar1 * 32767.0);
          piVar8 = (int *)&local_5a;
          (*local_58)((char *)piVar8,2);
          poVar10 = &((this->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        }
        else if (uVar12 == 0) {
          local_5e = (undefined1)(int)(fVar1 * 127.0);
          piVar8 = (int *)&local_5e;
          (*local_58)((char *)piVar8,1);
          poVar10 = &((this->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        }
        else {
          local_4c = (int)(fVar1 * 2.1474836e+09);
          piVar8 = &local_4c;
          (*local_58)((char *)piVar8,4);
          poVar10 = &((this->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl)->ostream;
        }
        std::ostream::write((char *)poVar10,(long)piVar8);
        pfVar7 = pfVar7 + 1;
      } while (pfVar7 != pfVar11);
      pfVar7 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = local_40;
      pfVar9 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    Impl::WriteHeader((this->impl_)._M_t.
                      super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>
                      .super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl,
                      ((long)pfVar9 - (long)pfVar7 >> 2) + uVar6);
    EVar5 = kNoError;
  }
  return EVar5;
}

Assistant:

Error File::Write(const std::vector<float>& data,
                  void (*encrypt)(char* data, size_t size)) {
  if (!impl_->ostream.is_open()) {
    return kNotOpen;
  }

  auto current_data_size = impl_->current_sample_index();
  auto bits_per_sample = impl_->header.fmt.bits_per_sample;

  // write each samples
  for (const auto sample : data) {
    if (bits_per_sample == 8) {
      // 8bits case
      int8_t value =
          static_cast<int8_t>(sample * std::numeric_limits<int8_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 16) {
      // 16 bits
      int16_t value =
          static_cast<int16_t>(sample * std::numeric_limits<int16_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 24) {
      // 24bits int doesn't exist in c++. We create a 3 * 8bits struct to
      // simulate
      int v = sample * INT24_MAX;
      int8_t value[3];
      value[0] = reinterpret_cast<char*>(&v)[0];
      value[1] = reinterpret_cast<char*>(&v)[1];
      value[2] = reinterpret_cast<char*>(&v)[2];

      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else if (bits_per_sample == 32) {
      // 32bits
      int32_t value =
          static_cast<int32_t>(sample * std::numeric_limits<int32_t>::max());
      encrypt(reinterpret_cast<char*>(&value), sizeof(value) / sizeof(char));
      impl_->ostream.write(reinterpret_cast<char*>(&value), sizeof(value));
    } else {
      return kInvalidFormat;
    }
  }

  // update header to show the right data size
  impl_->WriteHeader(current_data_size + data.size());

  return kNoError;
}